

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void TPZCompElHCurl<pzshape::TPZShapeCube>::TransformShape
               (TPZFMatrix<double> *phiref,REAL detjac,TPZFMatrix<double> *jacinv,
               TPZFMatrix<double> *axes,TPZFMatrix<double> *phi)

{
  TPZFMatrix<double> jacinvt;
  TPZFMatrix<double> axest;
  TPZFMatrix<double> local_270;
  TPZFMatrix<double> local_1e0;
  TPZFMatrix<double> local_150;
  TPZFMatrix<double> local_c0;
  
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_1e0.fElem = (double *)0x0;
  local_1e0.fGiven = (double *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  local_270.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_270.fElem = (double *)0x0;
  local_270.fGiven = (double *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_270.fWork.fStore = (double *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  (*(jacinv->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x2b])
            (jacinv,&local_270);
  (*(axes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x2b])
            (axes,&local_1e0);
  TPZFMatrix<double>::operator*(&local_150,&local_270,phiref);
  TPZFMatrix<double>::operator*(&local_c0,&local_1e0,&local_150);
  TPZFMatrix<double>::Transpose(&local_c0,&phi->super_TPZMatrix<double>);
  TPZFMatrix<double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<double>::~TPZFMatrix(&local_150);
  TPZFMatrix<double>::~TPZFMatrix(&local_270);
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::TransformShape(const TPZFMatrix<REAL> &phiref,
                                            const REAL detjac,
                                            const TPZFMatrix<REAL> &jacinv,
                                            const TPZFMatrix<REAL> &axes,
                                            TPZFMatrix<REAL> &phi)
{

    //applies covariant piola transform and compute the deformed vectors
    TPZFMatrix<REAL> axest, jacinvt;
    jacinv.Transpose(&jacinvt);
    axes.Transpose(&axest);

    (axest * (jacinvt * phiref)).Transpose(&phi);
}